

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseNextMap(FMapInfoParser *this,FString *mapname)

{
  FString *this_00;
  bool bVar1;
  uint uVar2;
  undefined1 local_1c [8];
  FName seq;
  FString *mapname_local;
  FMapInfoParser *this_local;
  
  unique0x10000131 = mapname;
  bVar1 = FScanner::CheckNumber(&this->sc);
  if (bVar1) {
    if ((this->HexenHack & 1U) == 0) {
      FString::Format(stack0xffffffffffffffe8,"MAP%02d",(ulong)(uint)(this->sc).Number);
    }
    else {
      FString::Format(stack0xffffffffffffffe8,"&wt@%02d",(ulong)(uint)(this->sc).Number);
    }
  }
  else {
    FScanner::MustGetString(&this->sc);
    FString::operator=(stack0xffffffffffffffe8,(this->sc).String);
    CheckEndSequence((FMapInfoParser *)local_1c);
    bVar1 = FName::operator!=((FName *)local_1c,NAME_None);
    this_00 = stack0xffffffffffffffe8;
    if (bVar1) {
      uVar2 = FName::operator_cast_to_int((FName *)local_1c);
      FString::Format(this_00,"enDSeQ%04x",(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void FMapInfoParser::ParseNextMap(FString &mapname)
{
	if (sc.CheckNumber())
	{
		if (HexenHack)
		{
			mapname.Format("&wt@%02d", sc.Number);
		}
		else
		{
			mapname.Format("MAP%02d", sc.Number);
		}
	}
	else
	{
		sc.MustGetString();
		mapname = sc.String;
		FName seq = CheckEndSequence();
		if (seq != NAME_None)
		{
			mapname.Format("enDSeQ%04x", int(seq));
		}
	}
}